

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_generator.hpp
# Opt level: O0

node_pointer __thiscall
ranger::bhvr_tree::
xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
::generate(xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
           *this,char *str,size_t len)

{
  bool bVar1;
  char *text;
  xml_node<char> *data_00;
  ostream *this_00;
  type node_00;
  long in_RCX;
  parse_error *e;
  xml_node<char> *data;
  xml_document<char> doc;
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> buf;
  size_t len_local;
  char *str_local;
  xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
  *this_local;
  node_pointer *node;
  
  std::allocator<char>::allocator();
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            ((vector<char,std::allocator<char>> *)local_40,(char *)len,(char *)(len + 1 + in_RCX),
             &local_41);
  std::allocator<char>::~allocator(&local_41);
  rapidxml::xml_document<char>::xml_document((xml_document<char> *)&data);
  text = std::vector<char,_std::allocator<char>_>::data
                   ((vector<char,_std::allocator<char>_> *)local_40);
  rapidxml::xml_document<char>::parse<0>((xml_document<char> *)&data,text);
  data_00 = rapidxml::xml_node<char>::first_node((xml_node<char> *)&data,"bhvr_tree",0,true);
  if (data_00 == (xml_node<char> *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"bhvr_tree_error: cannot find root node");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::
    unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>,std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>>>
    ::
    unique_ptr<std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>>,void>
              ((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>,std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>>>
                *)this);
  }
  else {
    generate_node_by_data(this,(xml_node<char> *)str);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
    if (bVar1) {
      node_00 = std::
                unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                ::operator*((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                             *)this);
      generate_children((xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
                         *)str,data_00,node_00);
    }
  }
  rapidxml::xml_document<char>::~xml_document((xml_document<char> *)&data);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return (__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
          )(__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
            )this;
}

Assistant:

node_pointer generate(const char* str, size_t len) const {
    try {
      std::vector<char> buf(str, str + len + 1);
      rapidxml::xml_document<> doc;
      doc.parse<0>(buf.data());

      auto data = doc.first_node("bhvr_tree");
      if (!data) {
        std::cerr << "bhvr_tree_error: cannot find root node" << std::endl;
        return node_pointer();
      }

      auto node = generate_node_by_data(data);
      if (node) {
        generate_children(data, *node);
      }

      return node;
    } catch (const rapidxml::parse_error& e) {
      std::cerr << "parse_error: " << e.what() << " [" << e.where<const char>() << "]" << std::endl;
    }

    return node_pointer();
  }